

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_digest_resp_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  if (imapcode == 0x2b) {
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","");
    if (data._4_4_ == CURLE_OK) {
      state(conn,IMAP_AUTHENTICATE_FINAL);
    }
  }
  else {
    Curl_failf(conn->data,"Authentication failed: %d",(ulong)(uint)imapcode);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_auth_digest_resp_resp(struct connectdata *conn,
                                                 int imapcode,
                                                 imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(imapcode != '+') {
    failf(data, "Authentication failed: %d", imapcode);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Send an empty response */
    result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", "");

    if(!result)
      state(conn, IMAP_AUTHENTICATE_FINAL);
  }

  return result;
}